

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

void TestStringToDoubleOctalString(void)

{
  double empty_string_value;
  double dVar1;
  char *str;
  bool all_used;
  int processed;
  int flags;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 uVar3;
  int in_stack_fffffffffffffcac;
  int line;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffcb4;
  undefined4 uVar5;
  int in_stack_fffffffffffffcbc;
  int line_00;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffefc;
  uc16 uVar8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 uVar12;
  double in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int iVar13;
  char *in_stack_ffffffffffffff20;
  
  iVar13 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  uVar8 = (uc16)((uint)in_stack_fffffffffffffefc >> 0x10);
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,
                    (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                    (double)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                    (char *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffcac,
              (char *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,
                    (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                    (double)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                    (char *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffcac,
              (char *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,
                    (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                    (double)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                    (char *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffcac,
              (char *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar2 = 0x3a;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,
                    (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                    (double)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffcac,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar3 = 0x3a;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,
                    (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                    (double)CONCAT44(in_stack_fffffffffffffcac,uVar3),
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffcac,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  line = 0x3a;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,
                    (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),line,
              (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar4 = 0x3a;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,(char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),line,
              (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,(char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),line,
              (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,(char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),line,
              (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,(char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),line,
              (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,(char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),line,
              (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,(char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),line,
              (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,(char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffcb4,uVar4),line,
              (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar5 = 0x3a;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcbc,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  line_00 = 0x3a;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),line_00,
                    (char *)CONCAT44(uVar5,uVar4),(double)CONCAT44(line,uVar3),
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar6 = 0x3a;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(in_stack_fffffffffffffcc4,uVar6),line_00,
                    (char *)CONCAT44(uVar5,uVar4),(double)CONCAT44(line,uVar3),
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar7 = 0x3a;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  uVar8 = 0;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar9 = 0x16;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(in_stack_ffffffffffffff04,uVar9),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar10 = 0x16;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
         (bool *)CONCAT44(uVar10,uVar9),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar11 = 0x16;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,
         (int *)CONCAT44(in_stack_ffffffffffffff0c,uVar11),(bool *)CONCAT44(uVar10,uVar9),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  uVar12 = 0x16;
  double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,in_stack_ffffffffffffff10,(int *)CONCAT44(uVar12,uVar11),
         (bool *)CONCAT44(uVar10,uVar9),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  empty_string_value = double_conversion::Double::NaN();
  StrToD(in_stack_ffffffffffffff20,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),
         (bool *)CONCAT44(uVar10,uVar9),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  dVar1 = double_conversion::Double::NaN();
  iVar13 = (int)((ulong)dVar1 >> 0x20);
  StrToD(in_stack_ffffffffffffff20,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),
         (bool *)CONCAT44(uVar10,uVar9),uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  str = (char *)double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckHelper((char *)CONCAT44(uVar5,uVar4),line,(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
              SUB41((uint)in_stack_fffffffffffffc9c >> 0x18,0));
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  double_conversion::Double::NaN();
  StrToD(str,iVar13,empty_string_value,(int *)CONCAT44(uVar12,uVar11),(bool *)CONCAT44(uVar10,uVar9)
         ,uVar8);
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),
                    (double)CONCAT44(line,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),
                    (double)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  CheckEqualsHelper((char *)CONCAT44(uVar7,uVar6),line_00,(char *)CONCAT44(uVar5,uVar4),line,
                    (char *)CONCAT44(uVar2,in_stack_fffffffffffffca0),in_stack_fffffffffffffc9c);
  return;
}

Assistant:

TEST(StringToDoubleOctalString) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;

  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("\n012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("\t00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("\n012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("\n01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("\n-\t01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("01234567e0", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_OCTALS;
  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("01234567e0", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(10.0, StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567foo ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(10.0, StrToD("012 foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00 foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567 foo", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567 foo", flags, Double::NaN(), &processed,
                  &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567e0", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567e", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(10.0, StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567foo ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(10.0, StrToD("012 foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(0.0, StrToD("00 foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(11, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567 foo", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567 foo", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);
}